

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateFile
               (FileDescriptor *file,bool is_descriptor,GeneratorContext *generator_context)

{
  bool bVar1;
  int iVar2;
  FileDescriptor *in_RDI;
  int i_2;
  int i_1;
  int i;
  GeneratorContext *in_stack_00000100;
  bool in_stack_0000010f;
  FileDescriptor *in_stack_00000110;
  GeneratorContext *in_stack_00000148;
  bool in_stack_00000157;
  ServiceDescriptor *in_stack_00000158;
  FileDescriptor *in_stack_00000160;
  GeneratorContext *in_stack_00000228;
  undefined1 in_stack_00000237;
  EnumDescriptor *in_stack_00000238;
  FileDescriptor *in_stack_00000240;
  GeneratorContext *in_stack_00000248;
  undefined1 in_stack_00000257;
  Descriptor *in_stack_00000258;
  FileDescriptor *in_stack_00000260;
  int local_24;
  int local_20;
  int local_1c;
  
  GenerateMetadataFile(in_stack_00000110,in_stack_0000010f,in_stack_00000100);
  for (local_1c = 0; iVar2 = FileDescriptor::message_type_count(in_RDI), local_1c < iVar2;
      local_1c = local_1c + 1) {
    FileDescriptor::message_type(in_RDI,local_1c);
    GenerateMessageFile(in_stack_00000260,in_stack_00000258,(bool)in_stack_00000257,
                        in_stack_00000248);
  }
  for (local_20 = 0; iVar2 = FileDescriptor::enum_type_count(in_RDI), local_20 < iVar2;
      local_20 = local_20 + 1) {
    FileDescriptor::enum_type(in_RDI,local_20);
    GenerateEnumFile(in_stack_00000240,in_stack_00000238,(bool)in_stack_00000237,in_stack_00000228);
  }
  FileDescriptor::options(in_RDI);
  bVar1 = FileOptions::php_generic_services((FileOptions *)0x4aaff9);
  if (bVar1) {
    for (local_24 = 0; iVar2 = FileDescriptor::service_count(in_RDI), local_24 < iVar2;
        local_24 = local_24 + 1) {
      FileDescriptor::service(in_RDI,local_24);
      GenerateServiceFile(in_stack_00000160,in_stack_00000158,in_stack_00000157,in_stack_00000148);
    }
  }
  return;
}

Assistant:

void GenerateFile(const FileDescriptor* file, bool is_descriptor,
                  GeneratorContext* generator_context) {
  GenerateMetadataFile(file, is_descriptor, generator_context);
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateMessageFile(file, file->message_type(i), is_descriptor,
                        generator_context);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnumFile(file, file->enum_type(i), is_descriptor,
                     generator_context);
  }
  if (file->options().php_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      GenerateServiceFile(file, file->service(i), is_descriptor,
                       generator_context);
    }
  }
}